

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  byte bVar1;
  short sVar2;
  ZSTD_literalCompressionMode_e ZVar3;
  uint *puVar4;
  ZSTD_entropyCTables_t *pZVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 in_RAX;
  HUF_CElt *table;
  long lVar8;
  long lVar9;
  uint uVar10;
  U32 UVar11;
  undefined1 auVar14 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint lit;
  undefined8 uStack_18;
  
  auVar15 = in_ZMM1._0_32_;
  ZVar3 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_18 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    pZVar5 = optPtr->symbolCosts;
    if (pZVar5 == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x460c,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((pZVar5->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar3 != ZSTD_lcm_uncompressed) {
        puVar4 = optPtr->litFreq;
        if (puVar4 == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4613,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        lVar8 = 0;
        do {
          bVar1 = *(byte *)((long)(pZVar5->huf).CTable + lVar8 * 4 + 2);
          if (0xb < bVar1) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4618,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar10 = 1 << (0xb - bVar1 & 0x1f);
          if (bVar1 == 0) {
            uVar10 = 1;
          }
          puVar4[lVar8] = uVar10;
          optPtr->litSum = optPtr->litSum + uVar10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x100);
      }
      sVar2 = (short)(pZVar5->fse).litlengthCTable[0];
      lVar8 = 1;
      if (sVar2 != 0) {
        lVar8 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar9 = 0;
      do {
        uVar10 = (pZVar5->fse).litlengthCTable[lVar8 + lVar9 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4624,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar7 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar7 = 1;
        }
        optPtr->litLengthFreq[lVar9] = uVar7;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x24);
      sVar2 = (short)(pZVar5->fse).matchlengthCTable[0];
      lVar8 = 1;
      if (sVar2 != 0) {
        lVar8 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      lVar9 = 0;
      do {
        uVar10 = (pZVar5->fse).matchlengthCTable[lVar8 + lVar9 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4630,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar7 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar7 = 1;
        }
        optPtr->matchLengthFreq[lVar9] = uVar7;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x35);
      sVar2 = (short)(pZVar5->fse).offcodeCTable[0];
      lVar8 = 1;
      if (sVar2 != 0) {
        lVar8 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      lVar9 = 0;
      do {
        uVar10 = (pZVar5->fse).offcodeCTable[lVar8 + lVar9 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x463c,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar7 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar7 = 1;
        }
        optPtr->offCodeFreq[lVar9] = uVar7;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      goto LAB_00170a71;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4643,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      uStack_18 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_18 + 4),src,srcSize);
      puVar4 = optPtr->litFreq;
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      lVar8 = 0;
      auVar15 = vpcmpeqd_avx2(auVar15,auVar15);
      do {
        auVar17 = vpsrld_avx2(*(undefined1 (*) [32])(puVar4 + lVar8),5);
        auVar17 = vpsubd_avx2(auVar17,auVar15);
        *(undefined1 (*) [32])(puVar4 + lVar8) = auVar17;
        auVar17 = vpaddd_avx2(auVar17,auVar13._0_32_);
        auVar13 = ZEXT3264(auVar17);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x100);
      auVar6 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
      auVar6 = vphaddd_avx(auVar6,auVar6);
      auVar6 = vphaddd_avx(auVar6,auVar6);
      optPtr->litSum = auVar6._0_4_;
    }
    puVar4 = optPtr->litLengthFreq;
    lVar8 = 0;
    auVar15 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar26._8_8_ = 0x8000000000000000;
    auVar26._0_8_ = 0x8000000000000000;
    auVar26._16_8_ = 0x8000000000000000;
    auVar26._24_8_ = 0x8000000000000000;
    auVar22._8_8_ = 0x8000000000000024;
    auVar22._0_8_ = 0x8000000000000024;
    auVar22._16_8_ = 0x8000000000000024;
    auVar22._24_8_ = 0x8000000000000024;
    auVar12._8_4_ = 1;
    auVar12._0_8_ = 0x100000001;
    auVar12._12_4_ = 1;
    auVar12._16_4_ = 1;
    auVar12._20_4_ = 1;
    auVar12._24_4_ = 1;
    auVar12._28_4_ = 1;
    do {
      auVar20._8_8_ = lVar8;
      auVar20._0_8_ = lVar8;
      auVar20._16_8_ = lVar8;
      auVar20._24_8_ = lVar8;
      auVar25 = vpor_avx2(auVar20,auVar15);
      auVar20 = vpor_avx2(auVar20,auVar17);
      auVar20 = vpcmpgtq_avx2(auVar22,auVar20 ^ auVar26);
      auVar25 = vpcmpgtq_avx2(auVar22,auVar25 ^ auVar26);
      auVar20 = vpackssdw_avx2(auVar25,auVar20);
      auVar6 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
      auVar6 = vpshufd_avx(auVar6,0xd8);
      auVar20 = vpmovzxwd_avx2(auVar6);
      auVar20 = vpslld_avx2(auVar20,0x1f);
      auVar20 = vpmaskmovd_avx2(auVar20,auVar12);
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar20;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x28);
    optPtr->litLengthSum = 0x24;
    puVar4 = optPtr->matchLengthFreq;
    lVar8 = 0;
    auVar25._8_8_ = 0x8000000000000035;
    auVar25._0_8_ = 0x8000000000000035;
    auVar25._16_8_ = 0x8000000000000035;
    auVar25._24_8_ = 0x8000000000000035;
    do {
      auVar21._8_8_ = lVar8;
      auVar21._0_8_ = lVar8;
      auVar21._16_8_ = lVar8;
      auVar21._24_8_ = lVar8;
      auVar20 = vpor_avx2(auVar21,auVar15);
      auVar22 = vpor_avx2(auVar21,auVar17);
      auVar22 = vpcmpgtq_avx2(auVar25,auVar22 ^ auVar26);
      auVar20 = vpcmpgtq_avx2(auVar25,auVar20 ^ auVar26);
      auVar22 = vpackssdw_avx2(auVar20,auVar22);
      auVar6 = vpackssdw_avx(auVar22._0_16_,auVar22._16_16_);
      auVar6 = vpshufd_avx(auVar6,0xd8);
      auVar22 = vpmovzxwd_avx2(auVar6);
      auVar22 = vpslld_avx2(auVar22,0x1f);
      auVar22 = vpmaskmovd_avx2(auVar22,auVar12);
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar22;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x38);
    optPtr->matchLengthSum = 0x35;
    puVar4 = optPtr->offCodeFreq;
    lVar8 = 0;
    do {
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar12;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    UVar11 = 0x20;
  }
  else {
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      puVar4 = optPtr->litFreq;
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      lVar8 = 0;
      auVar15 = vpcmpeqd_avx2(auVar15,auVar15);
      do {
        auVar17 = vpsrld_avx2(*(undefined1 (*) [32])(puVar4 + lVar8),5);
        auVar17 = vpsubd_avx2(auVar17,auVar15);
        *(undefined1 (*) [32])(puVar4 + lVar8) = auVar17;
        auVar17 = vpaddd_avx2(auVar17,auVar13._0_32_);
        auVar13 = ZEXT3264(auVar17);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x100);
      auVar6 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
      auVar6 = vphaddd_avx(auVar6,auVar6);
      auVar6 = vphaddd_avx(auVar6,auVar6);
      optPtr->litSum = auVar6._0_4_;
    }
    puVar4 = optPtr->litLengthFreq;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    lVar8 = 0;
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar16._8_8_ = 0x8000000000000000;
    auVar16._0_8_ = 0x8000000000000000;
    auVar16._16_8_ = 0x8000000000000000;
    auVar16._24_8_ = 0x8000000000000000;
    auVar12 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar18._8_8_ = 0x8000000000000024;
    auVar18._0_8_ = 0x8000000000000024;
    auVar18._16_8_ = 0x8000000000000024;
    auVar18._24_8_ = 0x8000000000000024;
    auVar15 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
    do {
      auVar23._8_8_ = lVar8;
      auVar23._0_8_ = lVar8;
      auVar23._16_8_ = lVar8;
      auVar23._24_8_ = lVar8;
      auVar22 = vpor_avx2(auVar23,auVar17);
      auVar26 = vpor_avx2(auVar23,auVar12);
      auVar26 = vpcmpgtq_avx2(auVar18,auVar26 ^ auVar16);
      auVar22 = vpcmpgtq_avx2(auVar18,auVar22 ^ auVar16);
      auVar22 = vpackssdw_avx2(auVar22,auVar26);
      auVar6 = vpackssdw_avx(auVar22._0_16_,auVar22._16_16_);
      auVar6 = vpshufd_avx(auVar6,0xd8);
      auVar26 = vpmovzxwd_avx2(auVar6);
      auVar25 = vpslld_avx2(auVar26,0x1f);
      auVar26 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(puVar4 + lVar8));
      auVar26 = vpsrld_avx2(auVar26,4);
      auVar20 = vpsubd_avx2(auVar26,auVar15);
      auVar26 = vpmaskmovd_avx2(auVar25,auVar20);
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar26;
      auVar25 = auVar13._0_32_;
      auVar26 = vpaddd_avx2(auVar20,auVar25);
      auVar13 = ZEXT3264(auVar26);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x28);
    auVar22 = vpermq_avx2(auVar22,0xd8);
    auVar26 = vblendvps_avx(auVar25,auVar26,auVar22);
    auVar6 = vphaddd_avx(auVar26._16_16_,auVar26._0_16_);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    optPtr->litLengthSum = auVar6._0_4_;
    puVar4 = optPtr->matchLengthFreq;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    lVar8 = 0;
    auVar19._8_8_ = 0x8000000000000035;
    auVar19._0_8_ = 0x8000000000000035;
    auVar19._16_8_ = 0x8000000000000035;
    auVar19._24_8_ = 0x8000000000000035;
    auVar15 = vpcmpeqd_avx2(auVar15,auVar15);
    do {
      auVar24._8_8_ = lVar8;
      auVar24._0_8_ = lVar8;
      auVar24._16_8_ = lVar8;
      auVar24._24_8_ = lVar8;
      auVar22 = vpor_avx2(auVar24,auVar17);
      auVar26 = vpor_avx2(auVar24,auVar12);
      auVar26 = vpcmpgtq_avx2(auVar19,auVar26 ^ auVar16);
      auVar22 = vpcmpgtq_avx2(auVar19,auVar22 ^ auVar16);
      auVar22 = vpackssdw_avx2(auVar22,auVar26);
      auVar6 = vpackssdw_avx(auVar22._0_16_,auVar22._16_16_);
      auVar6 = vpshufd_avx(auVar6,0xd8);
      auVar26 = vpmovzxwd_avx2(auVar6);
      auVar25 = vpslld_avx2(auVar26,0x1f);
      auVar26 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(puVar4 + lVar8));
      auVar26 = vpsrld_avx2(auVar26,4);
      auVar20 = vpsubd_avx2(auVar26,auVar15);
      auVar26 = vpmaskmovd_avx2(auVar25,auVar20);
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar26;
      auVar25 = auVar13._0_32_;
      auVar26 = vpaddd_avx2(auVar20,auVar25);
      auVar13 = ZEXT3264(auVar26);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x38);
    auVar15 = vpermq_avx2(auVar22,0xd8);
    auVar15 = vblendvps_avx(auVar25,auVar26,auVar15);
    auVar14 = auVar15._16_16_;
    auVar6 = vphaddd_avx(auVar14,auVar15._0_16_);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    optPtr->matchLengthSum = auVar6._0_4_;
    puVar4 = optPtr->offCodeFreq;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    lVar8 = 0;
    auVar15 = vpcmpeqd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar14));
    do {
      auVar17 = vpsrld_avx2(*(undefined1 (*) [32])(puVar4 + lVar8),4);
      auVar17 = vpsubd_avx2(auVar17,auVar15);
      *(undefined1 (*) [32])(puVar4 + lVar8) = auVar17;
      auVar17 = vpaddd_avx2(auVar17,auVar13._0_32_);
      auVar13 = ZEXT3264(auVar17);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    auVar6 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    auVar6 = vphaddd_avx(auVar6,auVar6);
    UVar11 = auVar6._0_4_;
  }
  optPtr->offCodeSum = UVar11;
LAB_00170a71:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
            }

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}